

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::NotImplementedException::~NotImplementedException(NotImplementedException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__NotImplementedException_00164da8;
  pcVar1 = (this->m_lineInfo).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_lineInfo).file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_what)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_what).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~NotImplementedException() throw() {}